

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O0

void AddEnvironmentApiLayers
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *enabled_layers)

{
  ulong uVar1;
  string local_b0 [48];
  string local_80 [32];
  undefined1 local_60 [8];
  string cur_search;
  size_t found;
  size_t last_found;
  string layers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *enabled_layers_local;
  
  layers.field_2._8_8_ = enabled_layers;
  PlatformUtilsGetEnv_abi_cxx11_((string *)&last_found,"XR_ENABLE_API_LAYERS");
  found = 0;
  cur_search.field_2._8_8_ = std::__cxx11::string::find_first_of((char)&last_found,0x3a);
  std::__cxx11::string::string((string *)local_60);
  while (cur_search.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_80,(ulong)&last_found);
    std::__cxx11::string::operator=((string *)local_60,local_80);
    std::__cxx11::string::~string(local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)layers.field_2._8_8_,(value_type *)local_60);
    found = cur_search.field_2._8_8_ + 1;
    cur_search.field_2._8_8_ = std::__cxx11::string::find_first_of((char)&last_found,0x3a);
  }
  uVar1 = std::__cxx11::string::size();
  if (found < uVar1) {
    std::__cxx11::string::substr((ulong)local_b0,(ulong)&last_found);
    std::__cxx11::string::operator=((string *)local_60,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)layers.field_2._8_8_,(value_type *)local_60);
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&last_found);
  return;
}

Assistant:

static void AddEnvironmentApiLayers(std::vector<std::string>& enabled_layers) {
    std::string layers = PlatformUtilsGetEnv(OPENXR_ENABLE_LAYERS_ENV_VAR);

    std::size_t last_found = 0;
    std::size_t found = layers.find_first_of(PATH_SEPARATOR);
    std::string cur_search;

    // Handle any path listings in the string (separated by the appropriate path separator)
    while (found != std::string::npos) {
        cur_search = layers.substr(last_found, found - last_found);
        enabled_layers.push_back(cur_search);
        last_found = found + 1;
        found = layers.find_first_of(PATH_SEPARATOR, last_found);
    }

    // If there's something remaining in the string, copy it over
    if (last_found < layers.size()) {
        cur_search = layers.substr(last_found);
        enabled_layers.push_back(cur_search);
    }
}